

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase347::run(TestCase347 *this)

{
  PromiseNode *pPVar1;
  long *plVar2;
  char cVar3;
  byte bVar4;
  __pid_t _Var5;
  PromiseFulfillerPair<kj::Promise<int>_> pair;
  PromiseFulfillerPair<int> inner;
  WaitScope waitScope;
  EventLoop loop;
  int local_9c;
  Promise<int> local_98;
  undefined8 *local_88;
  long *local_80;
  undefined8 *local_78;
  long *local_70;
  undefined8 *local_68;
  long *local_60;
  EventLoop *local_58;
  undefined4 local_50;
  __pid_t local_44;
  EventLoop local_40;
  
  EventLoop::EventLoop(&local_40);
  local_50 = 0xffffffff;
  local_58 = &local_40;
  EventLoop::enterScope(&local_40);
  newPromiseAndFulfiller<kj::Promise<int>>();
  newPromiseAndFulfiller<int>();
  cVar3 = (**(code **)(*local_80 + 0x10))();
  if (cVar3 == '\0' && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[45]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
               ,0x162,ERROR,"\"failed: expected \" \"pair.fulfiller->isWaiting()\"",
               (char (*) [45])"failed: expected pair.fulfiller->isWaiting()");
  }
  (**(code **)*local_80)(local_80,&local_78);
  bVar4 = (**(code **)(*local_80 + 0x10))();
  if ((bVar4 & _::Debug::minSeverity < 3) == 1) {
    _::Debug::log<char_const(&)[48]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
               ,0x164,ERROR,"\"failed: expected \" \"!(pair.fulfiller->isWaiting())\"",
               (char (*) [48])"failed: expected !(pair.fulfiller->isWaiting())");
  }
  local_9c = 0x7b;
  (**(code **)*local_60)();
  _Var5 = Promise<int>::wait(&local_98,&local_58);
  if ((_Var5 != 0x7b) && (_::Debug::minSeverity < 3)) {
    local_9c = 0x7b;
    local_44 = Promise<int>::wait(&local_98,&local_58);
    _::Debug::log<char_const(&)[57],int,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
               ,0x168,ERROR,
               "\"failed: expected \" \"(123) == (pair.promise.wait(waitScope))\", 123, pair.promise.wait(waitScope)"
               ,(char (*) [57])"failed: expected (123) == (pair.promise.wait(waitScope))",&local_9c,
               &local_44);
  }
  plVar2 = local_60;
  if (local_60 != (long *)0x0) {
    local_60 = (long *)0x0;
    (**(code **)*local_68)(local_68,(long)plVar2 + *(long *)(*plVar2 + -0x10));
  }
  plVar2 = local_70;
  if (local_70 != (long *)0x0) {
    local_70 = (long *)0x0;
    (**(code **)*local_78)(local_78,(long)plVar2 + *(long *)(*plVar2 + -0x10));
  }
  plVar2 = local_80;
  if (local_80 != (long *)0x0) {
    local_80 = (long *)0x0;
    (**(code **)*local_88)(local_88,(long)plVar2 + *(long *)(*plVar2 + -0x10));
  }
  pPVar1 = local_98.super_PromiseBase.node.ptr;
  if (local_98.super_PromiseBase.node.ptr != (PromiseNode *)0x0) {
    local_98.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    (**(local_98.super_PromiseBase.node.disposer)->_vptr_Disposer)
              (local_98.super_PromiseBase.node.disposer,
               pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode);
  }
  EventLoop::leaveScope(local_58);
  EventLoop::~EventLoop(&local_40);
  return;
}

Assistant:

TEST(Async, SeparateFulfillerChained) {
  EventLoop loop;
  WaitScope waitScope(loop);

  auto pair = newPromiseAndFulfiller<Promise<int>>();
  auto inner = newPromiseAndFulfiller<int>();

  EXPECT_TRUE(pair.fulfiller->isWaiting());
  pair.fulfiller->fulfill(kj::mv(inner.promise));
  EXPECT_FALSE(pair.fulfiller->isWaiting());

  inner.fulfiller->fulfill(123);

  EXPECT_EQ(123, pair.promise.wait(waitScope));
}